

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Synth.h
# Opt level: O0

void __thiscall
Blip_Synth<2,_15>::offset(Blip_Synth<2,_15> *this,blip_time_t time,int delta,Blip_Buffer *buf)

{
  offset_resampled(this,time,delta,buf);
  return;
}

Assistant:

void Blip_Synth<quality,range>::offset( blip_time_t time, int delta, Blip_Buffer* buf ) const {
	offset_resampled( time * buf->factor_ + buf->offset_, delta, buf );
}